

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl_Still::disconnectPorts(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  MMAL_CONNECTION_T *connection;
  
  connection = this->encoder_connection;
  if (connection->is_enabled != 0) {
    MVar1 = mmal_connection_disable(connection);
    if (MVar1 != MMAL_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&std::cout,this->API_NAME);
      std::operator<<(poVar2,": fail to disable encoder connection\n");
    }
    connection = this->encoder_connection;
    if (connection == (MMAL_CONNECTION_T *)0x0) {
      return;
    }
  }
  MVar1 = mmal_connection_destroy(connection);
  if (MVar1 == MMAL_SUCCESS) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,this->API_NAME);
  std::operator<<(poVar2,": fail to destroy encoder connection\n");
  return;
}

Assistant:

void Private_Impl_Still::disconnectPorts() {
            // disable connection if enabled
            if ( encoder_connection->is_enabled && mmal_connection_disable( encoder_connection ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": fail to disable encoder connection\n";
            }

            // destroy encoder connection
            // mmal_connection_disable call is mandatory before calling the destroy function otherwise it fails
            if ( encoder_connection && mmal_connection_destroy( encoder_connection ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": fail to destroy encoder connection\n";
            }
        }